

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O1

void __thiscall Fluid_Table::DrawHeader(Fluid_Table *this,char *s,int X,int Y,int W,int H)

{
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)W,(ulong)(uint)H);
  fl_draw_box(FL_THIN_UP_BOX,X,Y,W,H,(this->super_Fl_Table)._row_header_color);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x38);
  fl_draw(s,X,Y,W,H,0,(Fl_Image *)0x0,1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void DrawHeader(const char *s, int X, int Y, int W, int H) {
    fl_push_clip(X,Y,W,H);
    fl_draw_box(FL_THIN_UP_BOX, X,Y,W,H, row_header_color());
    fl_color(FL_BLACK);
    fl_draw(s, X,Y,W,H, FL_ALIGN_CENTER);
    fl_pop_clip();
  }